

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall
helics::Federate::handleError(Federate *this,int errorCode,string_view errorString,bool noThrow)

{
  FederateError *this_00;
  
  updateFederateMode(this,ERROR_STATE);
  if ((this->errorHandlerCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
              (&this->errorHandlerCallback,errorCode,errorString);
    return;
  }
  if (noThrow) {
    return;
  }
  this_00 = (FederateError *)__cxa_allocate_exception(0x30);
  FederateError::FederateError(this_00,errorCode,errorString);
  __cxa_throw(this_00,&FederateError::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void Federate::handleError(int errorCode, std::string_view errorString, bool noThrow)
{
    updateFederateMode(Modes::ERROR_STATE);

    if (errorHandlerCallback) {
        errorHandlerCallback(errorCode, errorString);
    } else if (!noThrow) {
        throw FederateError(errorCode, errorString);
    }
}